

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

uint32_t INTERPOLATE_PIXEL(uint32_t x,uint32_t a,uint32_t y,uint32_t b)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (y & 0xff00ff) * b + (x & 0xff00ff) * a;
  uVar1 = (y >> 8 & 0xff00ff) * b + (x >> 8 & 0xff00ff) * a;
  return uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) & 0xff00ff00 |
         uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
}

Assistant:

static inline uint32_t INTERPOLATE_PIXEL(uint32_t x, uint32_t a, uint32_t y, uint32_t b)
{
    uint32_t t = (x & 0xff00ff) * a + (y & 0xff00ff) * b;
    t = (t + ((t >> 8) & 0xff00ff) + 0x800080) >> 8;
    t &= 0xff00ff;
    x = ((x >> 8) & 0xff00ff) * a + ((y >> 8) & 0xff00ff) * b;
    x = (x + ((x >> 8) & 0xff00ff) + 0x800080);
    x &= 0xff00ff00;
    x |= t;
    return x;
}